

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reusable_node.h
# Opt level: O0

void reusable_node_advance(ReusableNode *self)

{
  uint uVar1;
  undefined4 uVar2;
  _Bool _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  Subtree *pSVar6;
  Subtree SVar7;
  uint uVar8;
  StackEntry popped_entry;
  uint32_t next_index;
  Subtree tree;
  uint32_t byte_offset;
  StackEntry last_entry;
  ReusableNode *self_local;
  
  if ((self->stack).size <= (self->stack).size - 1) {
    __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                  ,0x31,"void reusable_node_advance(ReusableNode *)");
  }
  pSVar6 = &(self->stack).contents[(self->stack).size - 1].tree;
  SVar7 = *pSVar6;
  last_entry.tree._4_4_ = SUB84(pSVar6[1],4);
  uVar4 = ts_subtree_total_bytes(SVar7);
  _Var3 = ts_subtree_has_external_tokens(SVar7);
  if (_Var3) {
    SVar7 = ts_subtree_last_external_token(SVar7);
    self->last_external_token = SVar7;
  }
  while( true ) {
    uVar8 = (self->stack).size - 1;
    (self->stack).size = uVar8;
    uVar2 = (self->stack).contents[uVar8].child_index;
    uVar8 = uVar2 + 1;
    if ((self->stack).size == 0) {
      return;
    }
    if ((self->stack).size <= (self->stack).size - 1) break;
    SVar7 = (self->stack).contents[(self->stack).size - 1].tree;
    uVar5 = ts_subtree_child_count(SVar7);
    if (uVar8 < uVar5) {
      array__grow((VoidArray *)self,0x10);
      uVar1 = (self->stack).size;
      (self->stack).size = uVar1 + 1;
      pSVar6 = &(self->stack).contents[uVar1].tree;
      *pSVar6 = ((SVar7.ptr)->field_17).field_0.children[uVar8];
      SVar7._4_4_ = last_entry.tree._4_4_ + uVar4;
      SVar7._0_4_ = uVar8;
      pSVar6[1] = SVar7;
      return;
    }
  }
  __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                ,0x3d,"void reusable_node_advance(ReusableNode *)");
}

Assistant:

static inline void reusable_node_advance(ReusableNode *self) {
  StackEntry last_entry = *array_back(&self->stack);
  uint32_t byte_offset = last_entry.byte_offset + ts_subtree_total_bytes(last_entry.tree);
  if (ts_subtree_has_external_tokens(last_entry.tree)) {
    self->last_external_token = ts_subtree_last_external_token(last_entry.tree);
  }

  Subtree tree;
  uint32_t next_index;
  do {
    StackEntry popped_entry = array_pop(&self->stack);
    next_index = popped_entry.child_index + 1;
    if (self->stack.size == 0) return;
    tree = array_back(&self->stack)->tree;
  } while (ts_subtree_child_count(tree) <= next_index);

  array_push(&self->stack, ((StackEntry) {
    .tree = tree.ptr->children[next_index],
    .child_index = next_index,
    .byte_offset = byte_offset,
  }));
}